

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy_s.c
# Opt level: O0

errno_t strncpy_s(char *s1,rsize_t s1max,char *s2,rsize_t n)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *local_40;
  char *src;
  char *dest;
  rsize_t n_local;
  char *s2_local;
  rsize_t s1max_local;
  char *s1_local;
  
  s2_local = (char *)s1max;
  if ((((s1 == (char *)0x0) || (s2_local = (char *)s1max, s2 == (char *)0x0)) ||
      (s2_local = (char *)s1max, 0x7fffffffffffffff < s1max)) ||
     ((s2_local = (char *)s1max, 0x7fffffffffffffff < n ||
      (local_40 = s2, src = s1, dest = (char *)n, s2_local = (char *)s1max, s1max == 0)))) {
LAB_00103308:
    if (((s1 != (char *)0x0) && (s2_local != (char *)0x0)) &&
       (s2_local < (char *)0x8000000000000000)) {
      *s1 = '\0';
    }
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    s1_local._4_4_ = 0x16;
  }
  else {
    do {
      pcVar2 = s2_local + -1;
      bVar3 = s2_local == (char *)0x0;
      s2_local = pcVar2;
      if ((bVar3) || ((src == s2 || (local_40 == s1)))) goto LAB_00103308;
      if (dest == (char *)0x0) break;
      cVar1 = *local_40;
      *src = cVar1;
      local_40 = local_40 + 1;
      src = src + 1;
      dest = dest + -1;
    } while (cVar1 != '\0');
    s1_local._4_4_ = 0;
  }
  return s1_local._4_4_;
}

Assistant:

errno_t strncpy_s( char * _PDCLIB_restrict s1, rsize_t s1max, const char * _PDCLIB_restrict s2, rsize_t n )
{
    char * dest = s1;
    const char * src = s2;

    if ( s1 != NULL && s2 != NULL && s1max <= RSIZE_MAX && n <= RSIZE_MAX && s1max != 0 )
    {
        while ( s1max-- )
        {
            if ( dest == s2 || src == s1 )
            {
                goto runtime_constraint_violation;
            }

            if ( n-- == 0 || ( *dest++ = *src++ ) == '\0' )
            {
                return 0;
            }
        }
    }

runtime_constraint_violation:

    if ( s1 != NULL && s1max > 0 && s1max <= RSIZE_MAX )
    {
        s1[0] = '\0';
    }

    _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
    return _PDCLIB_EINVAL;
}